

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-x25519.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  char *__format;
  anon_struct_96_3_03d04083 *paVar3;
  uint8_t check [32];
  
  paVar3 = table;
  __format = "dh-selftest: test number %d failed\n";
  for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 1) {
    x25519(check,paVar3->scalar,paVar3->point);
    iVar1 = bcmp(check,paVar3->result,0x20);
    if (iVar1 != 0) goto LAB_00101204;
    paVar3 = paVar3 + 1;
  }
  paVar3 = table;
  __format = "dh-selftest: (OLD API) test number %d failed\n";
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x400) {
      return 0;
    }
    DH(check,paVar3->scalar,paVar3->point);
    iVar1 = bcmp(check,paVar3->result,0x20);
    if (iVar1 != 0) break;
    lVar2 = lVar2 + 1;
    paVar3 = paVar3 + 1;
  }
LAB_00101204:
  fprintf(_stderr,__format,(ulong)((int)lVar2 + 1));
  return 1;
}

Assistant:

int
main()
{
	uint8_t check[X25519_KEY_LEN];
	int i;

	/*
	 * run x25519 tests against table
	 */
	for (i = 0; i < table_num; i++) {
		x25519(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: test number %d failed\n", i+1);
			return 1;
		}
	}


	/*
	 * test old interface
	 */
	for (i = 0; i < table_num; i++) {
		DH(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: (OLD API) test number %d failed\n", i+1);
			return 1;
		}
	}

	return 0;
}